

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

uint64_t __thiscall MemoryManager::getLong(MemoryManager *this,uint32_t addr,uint32_t *cycles)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  MemoryManager *this_00;
  ulong uVar7;
  uint64_t b8;
  uint64_t b7;
  uint64_t b6;
  uint64_t b5;
  uint64_t b4;
  uint64_t b3;
  uint64_t b2;
  uint64_t b1;
  uint32_t *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  uint32_t addr_00;
  MemoryManager *in_stack_ffffffffffffffb8;
  
  addr_00 = (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  bVar1 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  bVar2 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  bVar3 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  bVar4 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  bVar5 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  bVar6 = getByte(in_stack_ffffffffffffffb8,addr_00,in_stack_ffffffffffffffa8);
  this_00 = (MemoryManager *)(ulong)bVar6;
  bVar6 = getByte(this_00,addr_00,in_stack_ffffffffffffffa8);
  uVar7 = (ulong)bVar6;
  bVar6 = getByte(this_00,0,in_stack_ffffffffffffffa8);
  return (ulong)bVar1 + (ulong)bVar2 * 0x100 + (ulong)bVar3 * 0x10000 + (ulong)bVar4 * 0x1000000 +
         ((ulong)bVar5 << 0x20) + ((long)this_00 << 0x28) + (uVar7 << 0x30) + ((ulong)bVar6 << 0x38)
  ;
}

Assistant:

uint64_t MemoryManager::getLong(uint32_t addr, uint32_t *cycles) {
  uint64_t b1 = this->getByte(addr, cycles);
  uint64_t b2 = this->getByte(addr + 1);
  uint64_t b3 = this->getByte(addr + 2);
  uint64_t b4 = this->getByte(addr + 3);
  uint64_t b5 = this->getByte(addr + 4);
  uint64_t b6 = this->getByte(addr + 5);
  uint64_t b7 = this->getByte(addr + 6);
  uint64_t b8 = this->getByte(addr + 7);
  return b1 + (b2 << 8) + (b3 << 16) + (b4 << 24) + (b5 << 32) + (b6 << 40) +
         (b7 << 48) + (b8 << 56);
}